

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O0

void pzshape::TPZShapePiram::SideShape
               (int side,TPZVec<double> *point,TPZVec<long> *id,TPZVec<int> *order,
               TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  TPZVec<double> *in_RCX;
  int in_EDI;
  TPZVec<long> *in_R8;
  TPZVec<int> *in_R9;
  TPZFMatrix<double> *in_stack_00000a60;
  TPZFMatrix<double> *in_stack_00000a68;
  TPZVec<int> *in_stack_00000a70;
  TPZVec<long> *in_stack_00000a78;
  TPZVec<double> *in_stack_00000a80;
  TPZFMatrix<double> *in_stack_00000f50;
  TPZFMatrix<double> *in_stack_00000f58;
  TPZVec<int> *in_stack_00000f60;
  TPZVec<long> *in_stack_00000f68;
  TPZVec<double> *in_stack_00000f70;
  TPZFMatrix<double> *in_stack_00001390;
  TPZFMatrix<double> *in_stack_00001398;
  TPZVec<int> *in_stack_000013a0;
  TPZVec<long> *in_stack_000013a8;
  TPZVec<double> *in_stack_000013b0;
  TPZFMatrix<double> *in_stack_00001780;
  TPZFMatrix<double> *in_stack_00001788;
  TPZVec<int> *in_stack_00001790;
  TPZVec<long> *in_stack_00001798;
  TPZVec<double> *in_stack_000017a0;
  TPZFMatrix<double> *in_stack_ffffffffffffffc8;
  
  if ((in_EDI < 0) || (0x12 < in_EDI)) {
    std::operator<<((ostream *)&std::cerr,"TPZCompElPi3d::SideShapeFunction. Bad paramenter side.\n"
                   );
  }
  else if (in_EDI == 0x12) {
    Shape(in_stack_000017a0,in_stack_00001798,in_stack_00001790,in_stack_00001788,in_stack_00001780)
    ;
  }
  else if (in_EDI < 5) {
    TPZShapePoint::Shape
              (in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,(TPZFMatrix<double> *)0x1883d26);
  }
  else if (in_EDI < 0xd) {
    TPZShapeLinear::Shape
              (in_stack_00000a80,in_stack_00000a78,in_stack_00000a70,in_stack_00000a68,
               in_stack_00000a60);
  }
  else if (in_EDI == 0xd) {
    TPZShapeQuad::Shape(in_stack_00000f70,in_stack_00000f68,in_stack_00000f60,in_stack_00000f58,
                        in_stack_00000f50);
  }
  else if (in_EDI < 0x12) {
    TPZShapeTriang::Shape
              (in_stack_000013b0,in_stack_000013a8,in_stack_000013a0,in_stack_00001398,
               in_stack_00001390);
  }
  return;
}

Assistant:

void TPZShapePiram::SideShape(int side, TPZVec<REAL> &point, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		
		if(side<0 || side>18) PZError << "TPZCompElPi3d::SideShapeFunction. Bad paramenter side.\n";
		else if(side==18) Shape(point,id,order,phi,dphi);
		else if(side<5) TPZShapePoint::Shape(point,id,order,phi,dphi);
		else if(side<13) {//5 a 12
			TPZShapeLinear::Shape(point,id,order,phi,dphi);
		} else if(side == 13) {
			TPZShapeQuad::Shape(point,id,order,phi,dphi);
		} else if(side<18) {//faces 13  a 17
			TPZShapeTriang::Shape(point,id,order,phi,dphi);
		}
		
	}